

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O3

FT_Error load_post_names(TT_Face face)

{
  FT_Stream stream;
  long lVar1;
  byte bVar2;
  FT_UShort FVar3;
  FT_Int n;
  FT_Error FVar4;
  FT_ULong FVar5;
  FT_Memory buffer;
  FT_Char **P;
  FT_Byte *buffer_00;
  FT_Char *pFVar6;
  uint uVar7;
  FT_Memory memory;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  FT_UShort n_1;
  ulong uVar12;
  uint uVar13;
  FT_ULong local_70;
  FT_ULong post_len;
  ulong local_60;
  FT_Memory local_58;
  FT_Char **local_50;
  ulong local_48;
  FT_Memory local_40;
  FT_UShort local_36;
  FT_Error local_34;
  
  stream = (face->root).stream;
  FVar4 = (*face->goto_table)(face,0x706f7374,stream,&local_70);
  if (FVar4 != 0) {
    return FVar4;
  }
  FVar5 = FT_Stream_Pos(stream);
  uVar8 = FVar5 + local_70;
  lVar1 = (face->postscript).FormatType;
  FVar4 = FT_Stream_Skip(stream,0x20);
  if (FVar4 != 0) {
    return FVar4;
  }
  if (lVar1 != 0x25000) {
    FVar4 = 3;
    if (lVar1 != 0x20000) goto LAB_0021ddaa;
    memory = stream->memory;
    FVar3 = FT_Stream_ReadUShort(stream,&local_34);
    FVar4 = local_34;
    if ((local_34 != 0) || (FVar4 = 3, (face->max_profile).numGlyphs < FVar3)) goto LAB_0021ddaa;
    uVar12 = (ulong)FVar3;
    local_36 = FVar3;
    buffer = (FT_Memory)ft_mem_realloc(memory,2,0,uVar12,(void *)0x0,&local_34);
    P = (FT_Char **)0x0;
    if (local_34 == 0) {
      local_58 = memory;
      local_40 = buffer;
      local_34 = FT_Stream_EnterFrame(stream,(ulong)((uint)FVar3 + (uint)FVar3));
      if (local_34 == 0) {
        if (local_36 == 0) {
          FT_Stream_ExitFrame(stream);
          uVar9 = 0;
        }
        else {
          uVar11 = 0;
          do {
            FVar3 = FT_Stream_GetUShort(stream);
            *(FT_UShort *)((long)&local_40->user + uVar11 * 2) = FVar3;
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
          FT_Stream_ExitFrame(stream);
          uVar11 = 0;
          uVar13 = 0;
          do {
            uVar9 = *(ushort *)((long)&local_40->user + uVar11 * 2);
            uVar10 = uVar9 - 0x101;
            uVar7 = uVar13 & 0xffff;
            if ((int)uVar10 <= (int)uVar7) {
              uVar10 = uVar7;
            }
            uVar13 = uVar10;
            if (uVar9 < 0x102) {
              uVar13 = uVar7;
            }
            uVar9 = (ushort)uVar13;
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
        P = (FT_Char **)ft_mem_realloc(local_58,8,0,(ulong)uVar9,(void *)0x0,&local_34);
        buffer = local_40;
        memory = local_58;
        local_50 = P;
        if (local_34 == 0) {
          if (uVar9 != 0) {
            local_48 = 0;
            local_60 = (ulong)uVar9;
            do {
              FVar5 = FT_Stream_Pos(stream);
              if (uVar8 <= FVar5) {
                if ((ushort)local_48 < uVar9) {
                  goto LAB_0021deb4;
                }
                break;
              }
              bVar2 = FT_Stream_ReadChar(stream,&local_34);
              if (local_34 != 0) goto LAB_0021df25;
              uVar13 = (uint)bVar2;
              if ((uVar8 < bVar2) ||
                 (post_len = uVar8 - bVar2, FVar5 = FT_Stream_Pos(stream), post_len < FVar5)) {
                FVar5 = FT_Stream_Pos(stream);
                uVar13 = (int)uVar8 - (int)FVar5;
                if ((int)uVar13 < 1) {
                  uVar13 = 0;
                }
              }
              buffer_00 = (FT_Byte *)
                          ft_mem_realloc(local_58,1,0,(ulong)(uVar13 + 1),(void *)0x0,&local_34);
              local_50[local_48] = (FT_Char *)buffer_00;
              if (local_34 != 0) goto LAB_0021df25;
              local_34 = FT_Stream_Read(stream,buffer_00,(ulong)uVar13);
              if (local_34 != 0) goto LAB_0021df25;
              local_50[local_48][uVar13] = '\0';
              local_48 = local_48 + 1;
            } while (local_60 != local_48);
          }
          goto LAB_0021def5;
        }
      }
      else {
        P = (FT_Char **)0x0;
        buffer = local_40;
        memory = local_58;
      }
    }
    goto LAB_0021dd91;
  }
  local_40 = stream->memory;
  FVar3 = FT_Stream_ReadUShort(stream,&local_34);
  FVar4 = local_34;
  if (local_34 != 0) goto LAB_0021ddaa;
  uVar8 = (ulong)FVar3;
  FVar4 = 3;
  if ((0x102 < FVar3) || ((face->max_profile).numGlyphs <= (ushort)(FVar3 - 1))) goto LAB_0021ddaa;
  buffer = (FT_Memory)ft_mem_realloc(local_40,1,0,uVar8,(void *)0x0,&local_34);
  memory = local_40;
  if ((local_34 == 0) &&
     (local_34 = FT_Stream_Read(stream,(FT_Byte *)buffer,uVar8), memory = local_40, local_34 == 0))
  {
    uVar12 = 0;
    do {
      if (uVar8 < (long)(char)*(FT_Byte *)((long)&buffer->user + uVar12) + uVar12) {
        local_34 = 3;
        goto LAB_0021dda2;
      }
      uVar12 = uVar12 + 1;
    } while (uVar8 != uVar12);
    (face->postscript_names).names.format_20.num_glyphs = FVar3;
    (face->postscript_names).names.format_20.glyph_indices = (FT_UShort *)buffer;
    goto LAB_0021df1e;
  }
LAB_0021dda2:
  ft_mem_free(memory,buffer);
  FVar4 = local_34;
LAB_0021ddaa:
  (face->postscript_names).loaded = '\x01';
  return FVar4;
  while( true ) {
    *pFVar6 = '\0';
    local_48 = local_48 + 1;
    if (local_60 <= local_48) break;
LAB_0021deb4:
    pFVar6 = (FT_Char *)ft_mem_realloc(local_58,1,0,1,(void *)0x0,&local_34);
    local_50[local_48] = pFVar6;
    if (local_34 != 0) goto LAB_0021df25;
  }
LAB_0021def5:
  (face->postscript_names).names.format_20.num_glyphs = local_36;
  (face->postscript_names).names.format_20.num_names = uVar9;
  (face->postscript_names).names.format_20.glyph_indices = (FT_UShort *)local_40;
  (face->postscript_names).names.format_20.glyph_names = local_50;
LAB_0021df1e:
  FVar4 = 0;
  goto LAB_0021ddaa;
LAB_0021df25:
  P = local_50;
  memory = local_58;
  uVar8 = local_60;
  uVar12 = 0;
  do {
    ft_mem_free(memory,P[uVar12]);
    P[uVar12] = (FT_Char *)0x0;
    uVar12 = uVar12 + 1;
    buffer = local_40;
  } while (uVar8 != uVar12);
LAB_0021dd91:
  ft_mem_free(memory,P);
  goto LAB_0021dda2;
}

Assistant:

static FT_Error
  load_post_names( TT_Face  face )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Fixed   format;
    FT_ULong   post_len;
    FT_ULong   post_limit;


    /* get a stream for the face's resource */
    stream = face->root.stream;

    /* seek to the beginning of the PS names table */
    error = face->goto_table( face, TTAG_post, stream, &post_len );
    if ( error )
      goto Exit;

    post_limit = FT_STREAM_POS() + post_len;

    format = face->postscript.FormatType;

    /* go to beginning of subtable */
    if ( FT_STREAM_SKIP( 32 ) )
      goto Exit;

    /* now read postscript table */
    if ( format == 0x00020000L )
      error = load_format_20( face, stream, post_limit );
    else if ( format == 0x00025000L )
      error = load_format_25( face, stream, post_limit );
    else
      error = FT_THROW( Invalid_File_Format );

    face->postscript_names.loaded = 1;

  Exit:
    return error;
  }